

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

void vera::splitFacesFromVerticalRow<unsigned_char>
               (uchar *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<unsigned_char> **_faces)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  CubemapFace<unsigned_char> *pCVar4;
  uchar *puVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  
  lVar10 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _height;
  iVar2 = SUB164(auVar1 / ZEXT816(6),0);
  iVar9 = (int)_width;
  uVar3 = (long)((ulong)(uint)(iVar2 * iVar9) * 0x300000000) >> 0x20;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)uVar3) {
    uVar6 = uVar3;
  }
  for (; lVar10 != 6; lVar10 = lVar10 + 1) {
    pCVar4 = (CubemapFace<unsigned_char> *)operator_new(0x18);
    pCVar4->data = (uchar *)0x0;
    pCVar4->id = 0;
    pCVar4->width = 0;
    pCVar4->height = 0;
    pCVar4->currentOffset = 0;
    _faces[lVar10] = pCVar4;
    pCVar4->id = (int)lVar10;
    puVar5 = (uchar *)operator_new__(uVar6);
    pCVar4->data = puVar5;
    pCVar4->width = iVar9;
    pCVar4->height = iVar2;
    pCVar4->currentOffset = 0;
  }
  iVar9 = iVar9 * 3;
  iVar7 = 0;
  for (uVar6 = 0; uVar6 != _height; uVar6 = uVar6 + 1) {
    lVar10 = 6;
    iVar8 = iVar7;
    while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
      pCVar4 = _faces[(int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                           (long)iVar2)];
      if (pCVar4 != (CubemapFace<unsigned_char> *)0x0) {
        memcpy(pCVar4->data + pCVar4->currentOffset,_data + iVar8,
               (long)(_width * 0x300000000) >> 0x20);
        pCVar4->currentOffset = pCVar4->currentOffset + iVar9;
      }
      iVar8 = iVar8 + iVar9;
    }
    iVar7 = iVar7 + iVar9;
  }
  return;
}

Assistant:

void splitFacesFromVerticalRow(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width;
    int faceHeight = _height/6;


    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;
        for (int iFace = 0; iFace < 6; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //   0   1   2   3   4   5 j      
            //  +X  -X  +Y  -Y  +Z  -Z 
            //
            face = _faces[jFace];

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}